

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedInts::ByteSizeLong
          (TensorValue_RepeatedInts *this)

{
  bool bVar1;
  int iVar2;
  size_t size;
  long lVar3;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t sStack_30;
  uint32_t cached_has_bits;
  size_t total_size;
  TensorValue_RepeatedInts *this_local;
  memory_order __b;
  
  sStack_30 = 0;
  size = google::protobuf::internal::WireFormatLite::Int32Size(&this->values_);
  if (size != 0) {
    sStack_30 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)size);
    sStack_30 = sStack_30 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(size);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->_values_cached_byte_size_).super___atomic_base<int>._M_i = iVar2;
  sStack_30 = size + sStack_30;
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    sStack_30 = lVar3 + sStack_30;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_30);
  SetCachedSize(this,iVar2);
  return sStack_30;
}

Assistant:

size_t TensorValue_RepeatedInts::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue.RepeatedInts)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int32 values = 1 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->values_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _values_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}